

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToChild(BtCursor *pCur,u32 newPgno)

{
  BtShared *pBt_00;
  BtShared *pBt;
  u32 newPgno_local;
  BtCursor *pCur_local;
  
  pBt_00 = pCur->pBt;
  if (pCur->iPage < '\x13') {
    (pCur->info).nSize = 0;
    pCur->curFlags = pCur->curFlags & 0xf9;
    pCur->aiIdx[pCur->iPage] = pCur->ix;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage = pCur->iPage + '\x01';
    pCur_local._4_4_ = getAndInitPage(pBt_00,newPgno,&pCur->pPage,pCur,(uint)pCur->curPagerFlags);
  }
  else {
    pCur_local._4_4_ = sqlite3CorruptError(0x10acd);
  }
  return pCur_local._4_4_;
}

Assistant:

static int moveToChild(BtCursor *pCur, u32 newPgno){
  BtShared *pBt = pCur->pBt;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->iPage>=0 );
  if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->aiIdx[pCur->iPage] = pCur->ix;
  pCur->apPage[pCur->iPage] = pCur->pPage;
  pCur->ix = 0;
  pCur->iPage++;
  return getAndInitPage(pBt, newPgno, &pCur->pPage, pCur, pCur->curPagerFlags);
}